

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_union_suite.cpp
# Opt level: O2

void visitor_suite::test_void(void)

{
  storage_type data;
  type local_18 [2];
  undefined8 local_10;
  
  local_10 = 0;
  local_18[0].__data[0] = '\x01';
  trial::dynamic::detail::small_union<std::allocator<char>,int,unsigned_long,bool,int>::
  call<visitor_suite::visitor_void,void>
            ((small_union<std::allocator<char>,int,unsigned_long,bool,int> *)&local_18[0].__align);
  trial::dynamic::detail::small_union<std::allocator<char>,int,unsigned_long,bool,int>::
  call<visitor_suite::const_visitor_void,void>
            ((small_union<std::allocator<char>,int,unsigned_long,bool,int> *)&local_18[0].__align);
  trial::dynamic::detail::small_union<std::allocator<char>,_int,_unsigned_long,_bool,_int>::
  ~small_union((small_union<std::allocator<char>,_int,_unsigned_long,_bool,_int> *)
               &local_18[0].__align);
  return;
}

Assistant:

void test_void()
{
    storage_type data{true};
    data.call<visitor_void, void>();
    data.call<const_visitor_void, void>();
}